

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_rename_method(_glist *x,t_symbol *s,int ac,t_atom *av)

{
  t_symbol *ptVar1;
  _canvasenvironment *p_Var2;
  
  if (ac != 0) {
    if (av->a_type == A_DOLLSYM) {
      p_Var2 = canvas_getenv(x);
      pd_pushsym((t_pd *)x);
      ptVar1 = binbuf_realizedollsym((av->a_w).w_symbol,p_Var2->ce_argc,p_Var2->ce_argv,1);
      canvas_rename(x,ptVar1,(t_symbol *)0x0);
      pd_popsym((t_pd *)x);
      return;
    }
    if (av->a_type == A_SYMBOL) {
      ptVar1 = (av->a_w).w_symbol;
      goto LAB_0013acb7;
    }
  }
  ptVar1 = gensym("Pd");
LAB_0013acb7:
  canvas_rename(x,ptVar1,(t_symbol *)0x0);
  return;
}

Assistant:

static void canvas_rename_method(t_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    if (ac && av->a_type == A_SYMBOL)
        canvas_rename(x, av->a_w.w_symbol, 0);
    else if (ac && av->a_type == A_DOLLSYM)
    {
        t_canvasenvironment *e = canvas_getenv(x);
        canvas_setcurrent(x);
        canvas_rename(x, binbuf_realizedollsym(av->a_w.w_symbol,
            e->ce_argc, e->ce_argv, 1), 0);
        canvas_unsetcurrent(x);
    }
    else canvas_rename(x, gensym("Pd"), 0);
}